

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O0

void __thiscall priorityQueueTest_only_data_Test::TestBody(priorityQueueTest_only_data_Test *this)

{
  double dVar1;
  bool bVar2;
  const_reference pvVar3;
  T *pTVar4;
  char *pcVar5;
  AssertHelper local_150;
  Message local_148;
  int local_13c;
  size_type local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  int local_10c;
  size_t local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  size_t local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  value_type local_60;
  int local_54;
  undefined1 local_50 [4];
  uint i;
  Priority_queue pq;
  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> std_pq;
  priorityQueueTest_only_data_Test *this_local;
  
  std::priority_queue<double,std::vector<double,std::allocator<double>>,std::less<double>>::
  priority_queue<std::vector<double,std::allocator<double>>,void>
            ((priority_queue<double,std::vector<double,std::allocator<double>>,std::less<double>> *)
             &pq.currentsize);
  Priority_queue::Priority_queue((Priority_queue *)local_50);
  for (local_54 = 0; local_54 != 100000; local_54 = local_54 + 1) {
    local_60 = 1.0;
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> *
         )&pq.currentsize,&local_60);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000;
    Priority_queue::push((Priority_queue *)local_50,(T *)&gtest_ar.message_);
  }
  pvVar3 = std::
           priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
           ::top((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                  *)&pq.currentsize);
  dVar1 = *pvVar3;
  pTVar4 = Priority_queue::top((Priority_queue *)local_50);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"std_pq.top()","pq.top()",dVar1,*pTVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0x40,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_b8 = std::
               priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
               ::size((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                       *)&pq.currentsize);
    local_c0 = Priority_queue::size((Priority_queue *)local_50);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_b0,"std_pq.size()","pq.size()",&local_b8,&local_c0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar2) {
      testing::Message::Message(&local_c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x41,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      while (bVar2 = Priority_queue::empty((Priority_queue *)local_50), ((bVar2 ^ 0xffU) & 1) != 0)
      {
        pvVar3 = std::
                 priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                 ::top((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                        *)&pq.currentsize);
        dVar1 = *pvVar3;
        pTVar4 = Priority_queue::top((Priority_queue *)local_50);
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_e0,"std_pq.top()","pq.top()",dVar1,*pTVar4);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
        if (!bVar2) {
          testing::Message::Message(&local_e8);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                     ,0x43,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_e8);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
        if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0014beb4;
        std::
        priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
        pop((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
             *)&pq.currentsize);
        Priority_queue::pop((Priority_queue *)local_50);
      }
      local_108 = Priority_queue::size((Priority_queue *)local_50);
      local_10c = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                ((EqHelper<false> *)local_100,"pq.size()","0",&local_108,&local_10c);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar2) {
        testing::Message::Message(&local_118);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                   ,0x47,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_118);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_138 = std::
                    priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                    ::size((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                            *)&pq.currentsize);
        local_13c = 0;
        testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                  ((EqHelper<false> *)local_130,"std_pq.size()","0",&local_138,&local_13c);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar2) {
          testing::Message::Message(&local_148);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                     ,0x48,pcVar5);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::Message::~Message(&local_148);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar_1.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
LAB_0014beb4:
  Priority_queue::~Priority_queue((Priority_queue *)local_50);
  std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
  ~priority_queue((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                   *)&pq.currentsize);
  return;
}

Assistant:

TEST_F(priorityQueueTest, only_data) {
    std::priority_queue<double> std_pq;
    Priority_queue pq;
    for (unsigned int i = 0; i != 100000; ++i) {
        std_pq.push((double) 1);
        pq.push((double) 1);
    }
    ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
    ASSERT_EQ(std_pq.size(), pq.size());
    while (!pq.empty()) {
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        std_pq.pop();
        pq.pop();
    }
    ASSERT_EQ(pq.size(), 0);
    ASSERT_EQ(std_pq.size(), 0);

}